

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O2

int get_b64_value(uint8_t character)

{
  uint uVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,character);
  if ((byte)(character + 0xbf) < 0x1a) {
    return iVar2 + -0x41;
  }
  if ((byte)(character + 0x9f) < 0x1a) {
    return iVar2 + -0x47;
  }
  if ((byte)(character - 0x30) < 10) {
    return iVar2 + 4;
  }
  uVar1 = 0x3e;
  if (character != ' ') {
    uVar1 = -(uint)(character != '\n') | 0x3f;
  }
  return uVar1;
}

Assistant:

constexpr int get_b64_value(uint8_t character) {
    constexpr int ALPHABET_SIZE = 'Z' - 'A' + 1;
    if (character >= 'A' && character <= 'Z') {
        return character - 'A';
    } else if (character >= 'a' && character <= 'z') {
        return character - 'a' + ALPHABET_SIZE;
    } else if (character >= '0' && character <= '9') {
        return character - '0' + (2 * ALPHABET_SIZE);
    } else if (character == ' ') {
        return 2 * ALPHABET_SIZE + 10;
    } else if (character == '\n') {
        return 2 * ALPHABET_SIZE + 10 + 1;
    } else {
        return -1;
    }
}